

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O0

QpVector * __thiscall QpVector::operator-(QpVector *this)

{
  value_type vVar1;
  const_reference pvVar2;
  reference pvVar3;
  vector<double,_std::allocator<double>_> *this_00;
  const_reference pvVar4;
  reference pvVar5;
  QpVector *in_RSI;
  QpVector *in_RDI;
  HighsInt i;
  QpVector *result;
  value_type vVar6;
  QpVector *pQVar7;
  int local_18;
  
  pQVar7 = in_RDI;
  QpVector(in_RSI,(HighsInt)((ulong)in_RDI >> 0x20));
  for (local_18 = 0; local_18 < in_RSI->num_nz; local_18 = local_18 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RSI->index,(long)local_18);
    vVar6 = *pvVar2;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index,(long)local_18);
    *pvVar3 = vVar6;
    this_00 = &in_RSI->value;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RSI->index,(long)local_18);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar2);
    vVar1 = *pvVar4;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RSI->index,(long)local_18);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->value,(long)*pvVar2);
    *pvVar5 = -vVar1;
  }
  in_RDI->num_nz = in_RSI->num_nz;
  return pQVar7;
}

Assistant:

QpVector operator-() const {
    QpVector result(dim);

    for (HighsInt i = 0; i < num_nz; i++) {
      result.index[i] = index[i];
      result.value[index[i]] = -value[index[i]];
    }
    result.num_nz = num_nz;

    return result;
  }